

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _all.c
# Opt level: O2

int greatest_test_pre(char *name)

{
  unsigned_long uVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar3 = strlen(name);
  greatest_info.name_buf[0] = '\0';
  greatest_info.name_buf[1] = '\0';
  greatest_info.name_buf[2] = '\0';
  greatest_info.name_buf[3] = '\0';
  greatest_info.name_buf[4] = '\0';
  greatest_info.name_buf[5] = '\0';
  greatest_info.name_buf[6] = '\0';
  greatest_info.name_buf[7] = '\0';
  greatest_info.name_buf[8] = '\0';
  greatest_info.name_buf[9] = '\0';
  greatest_info.name_buf[10] = '\0';
  greatest_info.name_buf[0xb] = '\0';
  greatest_info.name_buf[0xc] = '\0';
  greatest_info.name_buf[0xd] = '\0';
  greatest_info.name_buf[0xe] = '\0';
  greatest_info.name_buf[0xf] = '\0';
  greatest_info.name_buf[0x10] = '\0';
  greatest_info.name_buf[0x11] = '\0';
  greatest_info.name_buf[0x12] = '\0';
  greatest_info.name_buf[0x13] = '\0';
  greatest_info.name_buf[0x14] = '\0';
  greatest_info.name_buf[0x15] = '\0';
  greatest_info.name_buf[0x16] = '\0';
  greatest_info.name_buf[0x17] = '\0';
  greatest_info.name_buf[0x18] = '\0';
  greatest_info.name_buf[0x19] = '\0';
  greatest_info.name_buf[0x1a] = '\0';
  greatest_info.name_buf[0x1b] = '\0';
  greatest_info.name_buf[0x1c] = '\0';
  greatest_info.name_buf[0x1d] = '\0';
  greatest_info.name_buf[0x1e] = '\0';
  greatest_info.name_buf[0x1f] = '\0';
  greatest_info.name_buf[0x20] = '\0';
  greatest_info.name_buf[0x21] = '\0';
  greatest_info.name_buf[0x22] = '\0';
  greatest_info.name_buf[0x23] = '\0';
  greatest_info.name_buf[0x24] = '\0';
  greatest_info.name_buf[0x25] = '\0';
  greatest_info.name_buf[0x26] = '\0';
  greatest_info.name_buf[0x27] = '\0';
  greatest_info.name_buf[0x28] = '\0';
  greatest_info.name_buf[0x29] = '\0';
  greatest_info.name_buf[0x2a] = '\0';
  greatest_info.name_buf[0x2b] = '\0';
  greatest_info.name_buf[0x2c] = '\0';
  greatest_info.name_buf[0x2d] = '\0';
  greatest_info.name_buf[0x2e] = '\0';
  greatest_info.name_buf[0x2f] = '\0';
  greatest_info.name_buf[0x30] = '\0';
  greatest_info.name_buf[0x31] = '\0';
  greatest_info.name_buf[0x32] = '\0';
  greatest_info.name_buf[0x33] = '\0';
  greatest_info.name_buf[0x34] = '\0';
  greatest_info.name_buf[0x35] = '\0';
  greatest_info.name_buf[0x36] = '\0';
  greatest_info.name_buf[0x37] = '\0';
  greatest_info.name_buf[0x38] = '\0';
  greatest_info.name_buf[0x39] = '\0';
  greatest_info.name_buf[0x3a] = '\0';
  greatest_info.name_buf[0x3b] = '\0';
  greatest_info.name_buf[0x3c] = '\0';
  greatest_info.name_buf[0x3d] = '\0';
  greatest_info.name_buf[0x3e] = '\0';
  greatest_info.name_buf[0x3f] = '\0';
  greatest_info.name_buf[0x40] = '\0';
  greatest_info.name_buf[0x41] = '\0';
  greatest_info.name_buf[0x42] = '\0';
  greatest_info.name_buf[0x43] = '\0';
  greatest_info.name_buf[0x44] = '\0';
  greatest_info.name_buf[0x45] = '\0';
  greatest_info.name_buf[0x46] = '\0';
  greatest_info.name_buf[0x47] = '\0';
  greatest_info.name_buf[0x48] = '\0';
  greatest_info.name_buf[0x49] = '\0';
  greatest_info.name_buf[0x4a] = '\0';
  greatest_info.name_buf[0x4b] = '\0';
  greatest_info.name_buf[0x4c] = '\0';
  greatest_info.name_buf[0x4d] = '\0';
  greatest_info.name_buf[0x4e] = '\0';
  greatest_info.name_buf[0x4f] = '\0';
  greatest_info.name_buf[0x50] = '\0';
  greatest_info.name_buf[0x51] = '\0';
  greatest_info.name_buf[0x52] = '\0';
  greatest_info.name_buf[0x53] = '\0';
  greatest_info.name_buf[0x54] = '\0';
  greatest_info.name_buf[0x55] = '\0';
  greatest_info.name_buf[0x56] = '\0';
  greatest_info.name_buf[0x57] = '\0';
  greatest_info.name_buf[0x58] = '\0';
  greatest_info.name_buf[0x59] = '\0';
  greatest_info.name_buf[0x5a] = '\0';
  greatest_info.name_buf[0x5b] = '\0';
  greatest_info.name_buf[0x5c] = '\0';
  greatest_info.name_buf[0x5d] = '\0';
  greatest_info.name_buf[0x5e] = '\0';
  greatest_info.name_buf[0x5f] = '\0';
  greatest_info.name_buf[0x60] = '\0';
  greatest_info.name_buf[0x61] = '\0';
  greatest_info.name_buf[0x62] = '\0';
  greatest_info.name_buf[99] = '\0';
  greatest_info.name_buf[100] = '\0';
  greatest_info.name_buf[0x65] = '\0';
  greatest_info.name_buf[0x66] = '\0';
  greatest_info.name_buf[0x67] = '\0';
  greatest_info.name_buf[0x68] = '\0';
  greatest_info.name_buf[0x69] = '\0';
  greatest_info.name_buf[0x6a] = '\0';
  greatest_info.name_buf[0x6b] = '\0';
  greatest_info.name_buf[0x6c] = '\0';
  greatest_info.name_buf[0x6d] = '\0';
  greatest_info.name_buf[0x6e] = '\0';
  greatest_info.name_buf[0x6f] = '\0';
  greatest_info.name_buf[0x70] = '\0';
  greatest_info.name_buf[0x71] = '\0';
  greatest_info.name_buf[0x72] = '\0';
  greatest_info.name_buf[0x73] = '\0';
  greatest_info.name_buf[0x74] = '\0';
  greatest_info.name_buf[0x75] = '\0';
  greatest_info.name_buf[0x76] = '\0';
  greatest_info.name_buf[0x77] = '\0';
  greatest_info.name_buf[0x78] = '\0';
  greatest_info.name_buf[0x79] = '\0';
  greatest_info.name_buf[0x7a] = '\0';
  greatest_info.name_buf[0x7b] = '\0';
  greatest_info.name_buf[0x7c] = '\0';
  greatest_info.name_buf[0x7d] = '\0';
  greatest_info.name_buf[0x7e] = '\0';
  greatest_info.name_buf[0x7f] = '\0';
  strncat(greatest_info.name_buf,name,0x7f);
  if ((greatest_info.name_suffix != (char *)0x0) && (sVar3 + 1 < 0x80)) {
    greatest_info.name_buf[sVar3] = '_';
    strncat(greatest_info.name_buf + sVar3 + 1,greatest_info.name_suffix,0x7e - sVar3);
  }
  iVar2 = greatest_name_match(greatest_info.name_buf,greatest_info.test_filter,1);
  uVar1 = greatest_info.prng[1].count;
  if (iVar2 != 0) {
    iVar2 = greatest_name_match(greatest_info.name_buf,greatest_info.test_exclude,0);
    uVar1 = greatest_info.prng[1].count;
    if ((greatest_info.flags & 2) == 0) {
      if (((iVar2 == 0) && (((greatest_info.flags & 1) == 0 || (greatest_info.suite.failed == 0))))
         && ((greatest_info.prng[1].random_order == '\0' ||
             ((uVar1 = greatest_info.prng[1].count + 1, greatest_info.prng[1].initialized != '\0' &&
              (bVar4 = greatest_info.prng[1].count == greatest_info.prng[1].state,
              greatest_info.prng[1].count = uVar1, bVar4)))))) {
        greatest_info.suite.pre_test = clock();
        if (greatest_info.suite.pre_test != -1) {
          if (greatest_info.setup != (undefined1 *)0x0) {
            (*(code *)greatest_info.setup)(greatest_info.setup_udata);
          }
          greatest_info.prng[1].count_run = greatest_info.prng[1].count_run + 1;
          return 1;
        }
        fprintf(_stdout,"clock error: %s\n","g->suite.pre_test");
        exit(1);
      }
    }
    else if (iVar2 == 0) {
      fprintf(_stdout,"  %s\n",0x2275f0);
      uVar1 = greatest_info.prng[1].count;
    }
  }
  greatest_info.prng[1].count = uVar1;
  greatest_info.name_suffix = (char *)0x0;
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN();

    RUN_SUITE(CGTFS_Database);
    RUN_SUITE(CGTFS_DatabaseStoring);
    RUN_SUITE(CGTFS_DatabaseFetching);  // Run CGTFS_DatabaseStoring first!
    RUN_SUITE(CGTFS_DatabaseUtils);

    RUN_SUITE(CGTFS_DatabaseAgency);
    RUN_SUITE(CGTFS_DatabaseCalendarDates);
    RUN_SUITE(CGTFS_DatabaseCalendarRecords);
    RUN_SUITE(CGTFS_DatabaseFareAttributes);
    RUN_SUITE(CGTFS_DatabaseFareFule);
    RUN_SUITE(CGTFS_DatabaseFeedInfo);
    RUN_SUITE(CGTFS_DatabaseFrequency);
    RUN_SUITE(CGTFS_DatabaseLevel);
    RUN_SUITE(CGTFS_DatabasePathway);
    RUN_SUITE(CGTFS_DatabaseRoute);
    RUN_SUITE(CGTFS_DatabaseShape);
    RUN_SUITE(CGTFS_DatabaseStopTime);
    RUN_SUITE(CGTFS_DatabaseStop);
    RUN_SUITE(CGTFS_DatabaseTransfers);
    RUN_SUITE(CGTFS_DatabaseTrip);

    RUN_SUITE(CGTFS_EnumParsing);
    RUN_SUITE(CGTFS_Feed);
    RUN_SUITE(CGTFS_Filenames);
    RUN_SUITE(CGTFS_Haversine);

    RUN_SUITE(CGTFS_FileUtils);
    RUN_SUITE(CGTFS_StrUtils);

    RUN_SUITE(CGTFS_RecordAgency);
    RUN_SUITE(CGTFS_RecordCalendarDate);
    RUN_SUITE(CGTFS_RecordCalendarRecord);
    RUN_SUITE(CGTFS_RecordFareAttributes);
    RUN_SUITE(CGTFS_RecordFareRule);
    RUN_SUITE(CGTFS_RecordFeedInfo);
    RUN_SUITE(CGTFS_RecordFrequency);
    RUN_SUITE(CGTFS_RecordLevel);
    RUN_SUITE(CGTFS_RecordPathway);
    RUN_SUITE(CGTFS_RecordRoute);
    RUN_SUITE(CGTFS_RecordShape);
    RUN_SUITE(CGTFS_RecordStopTime);
    RUN_SUITE(CGTFS_RecordStop);
    RUN_SUITE(CGTFS_RecordTransfer);
    RUN_SUITE(CGTFS_RecordTrip);

    RUN_SUITE(CGTFS_FileReading);

    GREATEST_MAIN_END();
}